

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimfmt.cpp
# Opt level: O2

void __thiscall icu_63::DecimalFormat::setGroupingSize(DecimalFormat *this,int32_t newValue)

{
  DecimalFormatProperties *pDVar1;
  
  pDVar1 = (this->fields->properties).
           super_LocalPointerBase<icu_63::number::impl::DecimalFormatProperties>.ptr;
  if (pDVar1->groupingSize == newValue) {
    return;
  }
  pDVar1->groupingSize = newValue;
  touchNoError(this);
  return;
}

Assistant:

void DecimalFormat::setGroupingSize(int32_t newValue) {
    if (newValue == fields->properties->groupingSize) { return; }
    fields->properties->groupingSize = newValue;
    touchNoError();
}